

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  bool dummy [4];
  bool at_end;
  bool local_51;
  ParamIterator<const_libaom_test::CodecFactory_*> *in_stack_ffffffffffffffb8;
  ParamIterator<aom_rc_mode> *other;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar1;
  bool local_21;
  undefined8 local_b;
  
  local_b._2_1_ = 0;
  std::
  get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<aom_superblock_size>,testing::internal::ParamIterator<aom_rc_mode>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
              *)0x3d3893);
  std::
  get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<aom_superblock_size>,testing::internal::ParamIterator<aom_rc_mode>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
              *)0x3d38a6);
  local_b._2_1_ =
       ParamIterator<const_libaom_test::CodecFactory_*>::operator==
                 ((ParamIterator<const_libaom_test::CodecFactory_*> *)
                  CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8);
  local_21 = true;
  if (!(bool)local_b._2_1_) {
    std::
    get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<aom_superblock_size>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x3d38f3);
    std::
    get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<aom_superblock_size>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x3d3906);
    local_21 = ParamIterator<libaom_test::TestMode>::operator==
                         ((ParamIterator<libaom_test::TestMode> *)
                          CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                          (ParamIterator<libaom_test::TestMode> *)in_stack_ffffffffffffffb8);
  }
  local_b._2_1_ = local_21;
  other = (ParamIterator<aom_rc_mode> *)&local_b;
  uVar1 = true;
  if (local_21 == false) {
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<aom_superblock_size>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x3d3957);
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<aom_superblock_size>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x3d396a);
    uVar1 = ParamIterator<aom_superblock_size>::operator==
                      ((ParamIterator<aom_superblock_size> *)
                       CONCAT17(uVar1,in_stack_ffffffffffffffc0),
                       (ParamIterator<aom_superblock_size> *)other);
  }
  local_b._2_1_ = uVar1;
  *(undefined1 *)
   &((_Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_superblock_size>_*,_false> *)
    &(other->impl_)._M_t.
     super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
     .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>)->
    _M_head_impl = uVar1;
  local_51 = true;
  if ((local_b._2_1_ & 1) == 0) {
    std::
    get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<aom_superblock_size>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x3d39bb);
    std::
    get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<aom_superblock_size>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x3d39cd);
    local_51 = ParamIterator<aom_rc_mode>::operator==
                         ((ParamIterator<aom_rc_mode> *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),
                          other);
  }
  return local_51;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }